

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall vkb::SystemInfo::is_layer_available(SystemInfo *this,char *layer_name)

{
  pointer pVVar1;
  int iVar2;
  bool bVar3;
  pointer __s2;
  bool bVar4;
  
  if (layer_name == (char *)0x0) {
    return false;
  }
  if (layer_name == (char *)0x0) {
    bVar3 = false;
  }
  else {
    __s2 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
    pVVar1 = (this->available_layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      bVar4 = __s2 == pVVar1;
      bVar3 = !bVar4;
      if (bVar4) {
        return bVar3;
      }
      iVar2 = strcmp(layer_name,__s2->layerName);
      __s2 = __s2 + 1;
    } while (iVar2 != 0);
  }
  return bVar3;
}

Assistant:

bool SystemInfo::is_layer_available(const char* layer_name) const {
    if (!layer_name) return false;
    return detail::check_layer_supported(available_layers, layer_name);
}